

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_ObjectArray<ON_Layer> *a)

{
  int iVar1;
  ON_Layer *object;
  bool local_31;
  bool local_21;
  int local_20;
  int iStack_1c;
  bool rc;
  int count;
  int i;
  ON_ObjectArray<ON_Layer> *a_local;
  ON_BinaryArchive *this_local;
  
  _count = a;
  a_local = (ON_ObjectArray<ON_Layer> *)this;
  ON_ClassArray<ON_Layer>::Empty((ON_ClassArray<ON_Layer> *)a);
  local_21 = ReadInt(this,&local_20);
  if (local_21) {
    ON_ClassArray<ON_Layer>::SetCapacity((ON_ClassArray<ON_Layer> *)_count,(long)local_20);
    iStack_1c = 0;
    while( true ) {
      local_31 = false;
      if (iStack_1c < local_20) {
        local_31 = local_21;
      }
      if (local_31 == false) {
        return local_21;
      }
      object = ON_ClassArray<ON_Layer>::AppendNew((ON_ClassArray<ON_Layer> *)_count);
      iVar1 = ReadObject(this,(ON_Object *)object);
      local_21 = iVar1 == 1;
      if (!local_21) break;
      iStack_1c = iStack_1c + 1;
    }
    ON_ClassArray<ON_Layer>::Remove((ON_ClassArray<ON_Layer> *)_count);
  }
  return local_21;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_ObjectArray<class ON_Layer>& a)
{
  a.Empty();
  int i, count;
  bool rc = ReadInt( &count );
  if (rc)
  {
    a.SetCapacity(count);
    for  ( i = 0; i < count && rc; i++ )
    {
      rc = (1 == ReadObject(a.AppendNew()));
      if (!rc)
      {
        a.Remove();
        break;
      }
    }
  }
  return rc;
}